

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

Gia_Man_t * Gia_ManPerformSopBalance(Gia_Man_t *p,int nCutNum,int nRelaxRatio,int fVerbose)

{
  int nRegs;
  Gia_Man_t *p_00;
  char *pcVar1;
  If_Par_t *pPars;
  If_Par_t Pars;
  If_Man_t *pIfMan;
  Gia_Man_t *pNew;
  int fVerbose_local;
  int nRelaxRatio_local;
  int nCutNum_local;
  Gia_Man_t *p_local;
  
  If_ManSetDefaultPars((If_Par_t *)&pPars);
  pPars._0_4_ = 6;
  Pars.fPower = 1;
  Pars.fEdge = 1;
  Pars.fSkipCutFilter = 1;
  Pars.fArea = 0;
  pPars._4_4_ = nCutNum;
  Pars.DelayTarget = (float)nRelaxRatio;
  Pars.fDoAverage = fVerbose;
  Pars.pReoMan = Gia_ManToIf(p,(If_Par_t *)&pPars);
  If_ManPerformMapping((If_Man_t *)Pars.pReoMan);
  p_00 = Gia_ManFromIfAig((If_Man_t *)Pars.pReoMan);
  If_ManStop((If_Man_t *)Pars.pReoMan);
  Gia_ManTransferTiming(p_00,p);
  if (p_00->pName == (char *)0x0) {
    pcVar1 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar1;
    pcVar1 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar1;
    nRegs = Gia_ManRegNum(p);
    Gia_ManSetRegNum(p_00,nRegs);
    return p_00;
  }
  __assert_fail("pNew->pName == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                ,0x8bf,"Gia_Man_t *Gia_ManPerformSopBalance(Gia_Man_t *, int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManPerformSopBalance( Gia_Man_t * p, int nCutNum, int nRelaxRatio, int fVerbose )
{
    Gia_Man_t * pNew;
    If_Man_t * pIfMan;
    If_Par_t Pars, * pPars = &Pars;
    If_ManSetDefaultPars( pPars );
    pPars->nCutsMax    = nCutNum;
    pPars->nRelaxRatio = nRelaxRatio;
    pPars->fVerbose    = fVerbose;
    pPars->nLutSize    = 6;
    pPars->fDelayOpt   = 1;
    pPars->fCutMin     = 1;
    pPars->fTruth      = 1;
    pPars->fExpRed     = 0;
    // perform mapping
    pIfMan = Gia_ManToIf( p, pPars );
    If_ManPerformMapping( pIfMan );
    pNew = Gia_ManFromIfAig( pIfMan );
    If_ManStop( pIfMan );
    Gia_ManTransferTiming( pNew, p );
    // transfer name
    assert( pNew->pName == NULL );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}